

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O0

QString * decorate(QString *__return_storage_ptr__,QString *text,Renderer *r,Context *ctx)

{
  QString local_58;
  QString local_40;
  Context *local_28;
  Context *ctx_local;
  Renderer *r_local;
  QString *text_local;
  
  local_28 = ctx;
  ctx_local = (Context *)r;
  r_local = (Renderer *)text;
  text_local = __return_storage_ptr__;
  Mustache::Renderer::render(&local_58,r,text,ctx);
  operator+(&local_40,"~",&local_58);
  operator+(__return_storage_ptr__,&local_40,"~");
  QString::~QString(&local_40);
  QString::~QString(&local_58);
  return __return_storage_ptr__;
}

Assistant:

static QString decorate(const QString& text, Mustache::Renderer* r, Mustache::Context* ctx)
{
	return "~" + r->render(text, ctx) + "~";
}